

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,const_iterator pos,
          Entry *args)

{
  void *pvVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pEVar6;
  const_iterator pEVar7;
  long lVar8;
  size_t __n;
  Entry temp;
  
  if (this->len == this->cap) {
    pEVar6 = emplaceRealloc<slang::IntervalMapDetails::Path::Entry>(this,pos,args);
    return pEVar6;
  }
  pEVar7 = this->data_ + this->len;
  if (pEVar7 == pos) {
    uVar2 = args->size;
    uVar3 = args->offset;
    pEVar7->node = args->node;
    pEVar7->size = uVar2;
    pEVar7->offset = uVar3;
  }
  else {
    pvVar1 = args->node;
    uVar4 = args->size;
    uVar5 = args->offset;
    uVar2 = pEVar7[-1].size;
    uVar3 = pEVar7[-1].offset;
    pEVar7->node = pEVar7[-1].node;
    pEVar7->size = uVar2;
    pEVar7->offset = uVar3;
    lVar8 = this->len * 0x10;
    __n = (long)this->data_ + ((lVar8 + -0x10) - (long)pos);
    if (__n != 0) {
      memmove((void *)((long)this->data_ + (lVar8 - __n)),pos,__n);
    }
    pos->node = pvVar1;
    pos->size = uVar4;
    pos->offset = uVar5;
  }
  this->len = this->len + 1;
  return pos;
}

Assistant:

iterator emplace(const_iterator pos, Args&&... args) {
        auto result = const_cast<iterator>(pos);
        if (len == cap)
            return emplaceRealloc(result, std::forward<Args>(args)...);

        if (pos == end()) {
            // Emplace at end can be constructed in place.
            new (end()) T(std::forward<Args>(args)...);
            len++;
            return result;
        }

        // Construct a temporary to avoid aliasing an existing element we're about to move.
        T temp(std::forward<Args>(args)...);

        // Manually move the last element backward by one because it's uninitialized space.
        new (end()) T(std::move(back()));

        // Now move everything else and insert our temporary.
        std::ranges::move_backward(result, end() - 1, end());
        *result = std::move(temp);

        len++;
        return result;
    }